

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<void_(solitaire::piles::PileId)>::Matches
          (OnCallSpec<void_(solitaire::piles::PileId)> *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<void_(solitaire::piles::PileId)> *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<solitaire::piles::PileId>>,std::tuple<solitaire::piles::PileId>>
                    ((tuple<testing::Matcher<solitaire::piles::PileId>_> *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::Matches
                         ((MatcherBase<const_std::tuple<solitaire::piles::PileId>_&> *)(this + 0x28)
                          ,args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }